

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O0

int http_parse_host_(char *buf,http_parser_url *u,int found_at)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  short sVar4;
  http_host_state hVar5;
  http_host_state new_s;
  size_t buflen;
  char *p;
  http_host_state s;
  int found_at_local;
  http_parser_url *u_local;
  char *buf_local;
  
  uVar1 = u->field_data[1].off;
  uVar2 = u->field_data[1].len;
  u->field_data[1].len = 0;
  p._0_4_ = s_http_host_start;
  if (found_at != 0) {
    p._0_4_ = s_http_userinfo_start;
  }
  buflen = (size_t)(buf + (int)(uint)u->field_data[1].off);
  while( true ) {
    if (buf + (int)((uint)uVar1 + (uint)uVar2) <= buflen) {
      if ((((http_host_state)p - s_http_userinfo_start < 4) ||
          ((http_host_state)p == s_http_host_v6)) || ((http_host_state)p == s_http_host_port_start))
      {
        buf_local._4_4_ = 1;
      }
      else {
        buf_local._4_4_ = 0;
      }
      return buf_local._4_4_;
    }
    hVar5 = http_parse_host_char_((http_host_state)p,*(char *)buflen);
    if (hVar5 == s_http_host_dead) break;
    sVar3 = (short)buflen;
    sVar4 = (short)buf;
    switch(hVar5) {
    case s_http_userinfo:
      if ((http_host_state)p != s_http_userinfo) {
        u->field_data[6].off = sVar3 - sVar4;
        u->field_data[6].len = 0;
        u->field_set = u->field_set | 0x40;
      }
      u->field_data[6].len = u->field_data[6].len + 1;
      break;
    default:
      break;
    case s_http_host:
      if ((http_host_state)p != s_http_host) {
        u->field_data[1].off = sVar3 - sVar4;
      }
      u->field_data[1].len = u->field_data[1].len + 1;
      break;
    case s_http_host_v6:
      if ((http_host_state)p != s_http_host_v6) {
        u->field_data[1].off = sVar3 - sVar4;
      }
      u->field_data[1].len = u->field_data[1].len + 1;
      break;
    case s_http_host_port:
      if ((http_host_state)p != s_http_host_port) {
        u->field_data[2].off = sVar3 - sVar4;
        u->field_data[2].len = 0;
        u->field_set = u->field_set | 4;
      }
      u->field_data[2].len = u->field_data[2].len + 1;
    }
    buflen = buflen + 1;
    p._0_4_ = hVar5;
  }
  return 1;
}

Assistant:

static int
http_parse_host_(const char * buf, struct http_parser_url *u, int found_at) {
  enum http_host_state s;

  const char *p;
  size_t buflen = u->field_data[UF_HOST].off + u->field_data[UF_HOST].len;

  u->field_data[UF_HOST].len = 0;

  s = found_at ? s_http_userinfo_start : s_http_host_start;

  for (p = buf + u->field_data[UF_HOST].off; p < buf + buflen; p++) {
    enum http_host_state new_s = http_parse_host_char_(s, *p);

    if (new_s == s_http_host_dead) {
      return 1;
    }

    switch(new_s) {
      case s_http_host:
        if (s != s_http_host) {
          u->field_data[UF_HOST].off = p - buf;
        }
        u->field_data[UF_HOST].len++;
        break;

      case s_http_host_v6:
        if (s != s_http_host_v6) {
          u->field_data[UF_HOST].off = p - buf;
        }
        u->field_data[UF_HOST].len++;
        break;

      case s_http_host_port:
        if (s != s_http_host_port) {
          u->field_data[UF_PORT].off = p - buf;
          u->field_data[UF_PORT].len = 0;
          u->field_set |= (1 << UF_PORT);
        }
        u->field_data[UF_PORT].len++;
        break;

      case s_http_userinfo:
        if (s != s_http_userinfo) {
          u->field_data[UF_USERINFO].off = p - buf ;
          u->field_data[UF_USERINFO].len = 0;
          u->field_set |= (1 << UF_USERINFO);
        }
        u->field_data[UF_USERINFO].len++;
        break;

      default:
        break;
    }
    s = new_s;
  }

  /* Make sure we don't end somewhere unexpected */
  switch (s) {
    case s_http_host_start:
    case s_http_host_v6_start:
    case s_http_host_v6:
    case s_http_host_port_start:
    case s_http_userinfo:
    case s_http_userinfo_start:
      return 1;
    default:
      break;
  }

  return 0;
}